

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ryg_dxt.cpp
# Opt level: O0

void ryg_dxt::PrepareOptTable3(sU8 *Table,sU8 *expand,sInt size)

{
  byte bVar1;
  byte bVar2;
  sInt sVar3;
  sInt sVar4;
  int iVar5;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  sInt err;
  sInt maxe;
  sInt mine;
  sInt max;
  sInt min;
  sInt bestErr;
  sInt i;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  
  for (local_18 = 0; local_18 < 0x100; local_18 = local_18 + 1) {
    local_1c = 0x100;
    for (local_20 = 0; local_20 < in_EDX; local_20 = local_20 + 1) {
      for (local_24 = 0; local_24 < in_EDX; local_24 = local_24 + 1) {
        bVar1 = *(byte *)(in_RSI + local_20);
        bVar2 = *(byte *)(in_RSI + local_24);
        sVar3 = sAbs(((int)((uint)bVar1 + (uint)bVar2) >> 1) - local_18);
        sVar4 = sAbs((uint)bVar2 - (uint)bVar1);
        iVar5 = ((sVar4 << 3) >> 8) + sVar3;
        if (iVar5 < local_1c) {
          *(char *)(in_RDI + (local_18 << 1)) = (char)local_24;
          *(char *)(in_RDI + (local_18 * 2 + 1)) = (char)local_20;
          local_1c = iVar5;
        }
      }
    }
  }
  return;
}

Assistant:

static void PrepareOptTable3(sU8* Table, const sU8* expand, sInt size) {
  for (sInt i = 0; i < 256; i++) {
    sInt bestErr = 256;

    for (sInt min = 0; min < size; min++) {
      for (sInt max = 0; max < size; max++) {
        sInt mine = expand[min];
        sInt maxe = expand[max];
        sInt err = sAbs(((mine + maxe) >> 1) - i);
        err += ((sAbs(maxe - mine) * 8) >> 8);  // approx. .03f

        if (err < bestErr) {
          Table[i * 2 + 0] = max;
          Table[i * 2 + 1] = min;
          bestErr = err;
        }
      }
    }
  }
}